

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

String * asl::encodeHex(String *__return_storage_ptr__,byte *data,int n)

{
  anon_union_16_2_78e7fdac_for_String_2 *paVar1;
  long lVar2;
  
  String::alloc(__return_storage_ptr__,n * 2);
  __return_storage_ptr__->_len = n * 2;
  paVar1 = &__return_storage_ptr__->field_2;
  if (__return_storage_ptr__->_size != 0) {
    paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
  }
  *(undefined1 *)((long)paVar1 + (long)n * 2) = 0;
  if (0 < n) {
    lVar2 = 0;
    do {
      paVar1 = &__return_storage_ptr__->field_2;
      if (__return_storage_ptr__->_size != 0) {
        paVar1 = (anon_union_16_2_78e7fdac_for_String_2 *)(__return_storage_ptr__->field_2)._str;
      }
      snprintf(paVar1->_space + lVar2,3,"%02x",(ulong)*data);
      lVar2 = lVar2 + 2;
      data = data + 1;
    } while ((ulong)(uint)n * 2 != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeHex(const byte* data, int n)
{
	String h(2*n, 2*n);
	for (int i = 0; i < n; i++)
		snprintf(&h[2*i], 3, "%02x", data[i]);
	return h;
}